

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  bool bVar1;
  ImGuiWindow *potential_parent;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool mouse_dragging_extern_payload;
  bool mouse_avail_unless_popup_close;
  bool mouse_avail;
  int i;
  bool mouse_any_down;
  int mouse_earliest_down;
  bool has_open_modal;
  bool has_open_popup;
  ImGuiWindow *modal_window;
  bool clear_hovered_windows;
  ImGuiIO *io;
  ImGuiContext *g;
  bool local_61;
  undefined1 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa1;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 in_stack_ffffffffffffffa4;
  byte bVar5;
  undefined1 in_stack_ffffffffffffffa5;
  byte bVar6;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  ImVec2 *lhs;
  int local_40;
  int local_38;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiIO *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_10 = &GImGui->IO;
  lhs = &(GImGui->Style).TouchExtraPadding;
  ImVec2::ImVec2(&local_20,4.0,4.0);
  local_18 = ImMax(lhs,(ImVec2 *)
                       CONCAT17(in_stack_ffffffffffffffa7,
                                CONCAT16(in_stack_ffffffffffffffa6,
                                         CONCAT15(in_stack_ffffffffffffffa5,
                                                  CONCAT14(in_stack_ffffffffffffffa4,
                                                           CONCAT13(in_stack_ffffffffffffffa3,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  CONCAT11(in_stack_ffffffffffffffa1,
                                                           in_stack_ffffffffffffffa0))))))));
  local_8->WindowsHoverPadding = local_18;
  bVar4 = false;
  FindHoveredWindow();
  potential_parent = GetTopMostPopupModal();
  if (((potential_parent != (ImGuiWindow *)0x0) && (local_8->HoveredWindow != (ImGuiWindow *)0x0))
     && (bVar1 = IsWindowWithinBeginStackOf(local_8->HoveredWindow->RootWindow,potential_parent),
        !bVar1)) {
    bVar4 = true;
  }
  if ((local_10->ConfigFlags & 0x10U) != 0) {
    bVar4 = true;
  }
  bVar1 = 0 < (local_8->OpenPopupStack).Size;
  local_38 = -1;
  bVar2 = false;
  for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
    if ((local_10->MouseClicked[local_40] & 1U) != 0) {
      local_10->MouseDownOwned[local_40] = local_8->HoveredWindow != (ImGuiWindow *)0x0 || bVar1;
      local_10->MouseDownOwnedUnlessPopupClose[local_40] =
           local_8->HoveredWindow != (ImGuiWindow *)0x0 || potential_parent != (ImGuiWindow *)0x0;
    }
    bVar2 = bVar2 || (local_10->MouseDown[local_40] & 1U) != 0;
    if (((local_10->MouseDown[local_40] & 1U) != 0) &&
       ((local_38 == -1 ||
        (local_10->MouseClickedTime[local_40] < local_10->MouseClickedTime[local_38])))) {
      local_38 = local_40;
    }
  }
  bVar6 = 1;
  if (local_38 != -1) {
    bVar6 = local_10->MouseDownOwned[local_38];
  }
  bVar5 = 1;
  if (local_38 != -1) {
    bVar5 = local_10->MouseDownOwnedUnlessPopupClose[local_38];
  }
  bVar3 = false;
  if ((local_8->DragDropActive & 1U) != 0) {
    bVar3 = (local_8->DragDropSourceFlags & 0x10U) != 0;
  }
  if (((bVar6 & 1) == 0) && (!bVar3)) {
    bVar4 = true;
  }
  if (bVar4) {
    local_8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    local_8->HoveredWindow = (ImGuiWindow *)0x0;
  }
  if (local_8->WantCaptureMouseNextFrame == -1) {
    if (((bVar6 & 1) == 0) ||
       ((bVar4 = true, local_8->HoveredWindow == (ImGuiWindow *)0x0 && (bVar4 = true, !bVar2)))) {
      bVar4 = bVar1;
    }
    local_10->WantCaptureMouse = bVar4;
    if (((bVar5 & 1) == 0) ||
       ((bVar4 = true, local_8->HoveredWindow == (ImGuiWindow *)0x0 && (bVar4 = true, !bVar2)))) {
      bVar4 = potential_parent != (ImGuiWindow *)0x0;
    }
    local_10->WantCaptureMouseUnlessPopupClose = bVar4;
  }
  else {
    bVar4 = local_8->WantCaptureMouseNextFrame != 0;
    local_10->WantCaptureMouseUnlessPopupClose = bVar4;
    local_10->WantCaptureMouse = bVar4;
  }
  if (local_8->WantCaptureKeyboardNextFrame == -1) {
    local_10->WantCaptureKeyboard = local_8->ActiveId != 0 || potential_parent != (ImGuiWindow *)0x0
    ;
  }
  else {
    local_10->WantCaptureKeyboard = local_8->WantCaptureKeyboardNextFrame != 0;
  }
  if ((((local_10->NavActive & 1U) != 0) && ((local_10->ConfigFlags & 1U) != 0)) &&
     ((local_10->ConfigFlags & 8U) == 0)) {
    local_10->WantCaptureKeyboard = true;
  }
  if (local_8->WantTextInputNextFrame == -1) {
    local_61 = false;
  }
  else {
    local_61 = local_8->WantTextInputNextFrame != 0;
  }
  local_10->WantTextInput = local_61;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowWithinBeginStackOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}